

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cpp
# Opt level: O0

Camera * newCamera(Json *conf)

{
  bool bVar1;
  undefined8 *puVar2;
  const_reference in_RDI;
  char *in_stack_00000048;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_00000050;
  Json *in_stack_00000108;
  ThinlensCamera *in_stack_00000110;
  char *in_stack_ffffffffffffffe8;
  Camera *local_8;
  
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_00000050,in_stack_00000048);
  bVar1 = nlohmann::operator==<const_char_*,_0>(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_8 = (Camera *)operator_new(0x60);
    PinholeCamera::PinholeCamera((PinholeCamera *)in_stack_00000110,in_stack_00000108);
  }
  else {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_00000050,in_stack_00000048);
    bVar1 = nlohmann::operator==<const_char_*,_0>(in_RDI,in_stack_ffffffffffffffe8);
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "unrecognized camera type";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    local_8 = (Camera *)operator_new(0x68);
    ThinlensCamera::ThinlensCamera(in_stack_00000110,in_stack_00000108);
  }
  return local_8;
}

Assistant:

Camera* newCamera(const Json& conf) {
	if (conf["type"] == "pinhole")
		return new PinholeCamera(conf);
	if (conf["type"] == "thinlens")
		return new ThinlensCamera(conf);
	throw "unrecognized camera type";
}